

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

M44d * Imath_2_5::procrustesRotationAndTranslation<float>
                 (M44d *__return_storage_ptr__,Vec3<float> *A,Vec3<float> *B,float *weights,
                 size_t numPoints,bool doScale)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  long lVar12;
  double *pdVar13;
  size_t sVar14;
  double *pdVar15;
  int i_2;
  double (*V_00) [3];
  long lVar16;
  long lVar17;
  double (*A_00) [3];
  float *pfVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar32;
  double dVar33;
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  M33d Qt;
  V3d S;
  M33d U;
  M33d C;
  M33d V;
  double local_1d8 [10];
  double local_188;
  double dStack_180;
  undefined1 local_178 [16];
  Vec3<double> local_168;
  Matrix33<double> local_150;
  double local_108;
  double dStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[1][1] = 0.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar31 = ZEXT816(0);
    if (weights == (float *)0x0) {
      lVar12 = 8;
      auVar35 = ZEXT816(0);
      auVar34 = ZEXT816(0);
      sVar14 = numPoints;
      do {
        uVar1 = *(undefined8 *)((long)A + lVar12 + -8);
        dVar33 = auVar35._8_8_;
        auVar35._0_8_ = auVar35._0_8_ + (double)(float)uVar1;
        auVar35._8_8_ = dVar33 + (double)(float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)B + lVar12 + -8);
        dVar33 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + (double)(float)uVar1;
        auVar31._8_8_ = dVar33 + (double)(float)((ulong)uVar1 >> 0x20);
        dVar33 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + (double)*(float *)((long)&B->x + lVar12);
        auVar34._8_8_ = dVar33 + (double)*(float *)((long)&A->x + lVar12);
        lVar12 = lVar12 + 0xc;
        sVar14 = sVar14 - 1;
      } while (sVar14 != 0);
      auVar22._8_4_ = (int)(numPoints >> 0x20);
      auVar22._0_8_ = numPoints;
      auVar22._12_4_ = 0x45300000;
      dVar33 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar33 = 0.0;
      lVar12 = 2;
      sVar14 = 0;
      auVar35 = ZEXT816(0);
      auVar34 = ZEXT816(0);
      do {
        dVar21 = (double)weights[sVar14];
        dVar33 = dVar33 + dVar21;
        uVar1 = *(undefined8 *)((long)A + lVar12 * 4 + -8);
        dVar32 = auVar35._8_8_;
        auVar35._0_8_ = auVar35._0_8_ + (double)(float)uVar1 * dVar21;
        auVar35._8_8_ = dVar32 + (double)(float)((ulong)uVar1 >> 0x20) * dVar21;
        uVar1 = *(undefined8 *)((long)B + lVar12 * 4 + -8);
        dVar32 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + (double)(float)uVar1 * dVar21;
        auVar31._8_8_ = dVar32 + (double)(float)((ulong)uVar1 >> 0x20) * dVar21;
        dVar32 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + (double)(&B->x)[lVar12] * dVar21;
        auVar34._8_8_ = dVar32 + (double)(&A->x)[lVar12] * dVar21;
        sVar14 = sVar14 + 1;
        lVar12 = lVar12 + 3;
      } while (numPoints != sVar14);
    }
    uVar20 = (undefined4)((ulong)dVar33 >> 0x20);
    uVar19 = SUB84(dVar33,0);
    if ((dVar33 != 0.0) || (NAN(dVar33))) {
      auVar2._8_4_ = uVar19;
      auVar2._0_8_ = dVar33;
      auVar2._12_4_ = uVar20;
      local_178 = divpd(auVar35,auVar2);
      auVar3._8_4_ = uVar19;
      auVar3._0_8_ = dVar33;
      auVar3._12_4_ = uVar20;
      auVar31 = divpd(auVar31,auVar3);
      auVar4._8_4_ = uVar19;
      auVar4._0_8_ = dVar33;
      auVar4._12_4_ = uVar20;
      auVar34 = divpd(auVar34,auVar4);
      local_188 = auVar34._8_8_;
      local_108 = 0.0;
      dStack_100 = 0.0;
      local_c8 = 0.0;
      dVar32 = auVar34._0_8_;
      dVar33 = auVar31._0_8_;
      dVar21 = auVar31._8_8_;
      if (weights == (float *)0x0) {
        lVar12 = 8;
        dVar28 = 0.0;
        dVar25 = 0.0;
        dVar24 = 0.0;
        dVar6 = 0.0;
        dVar7 = 0.0;
        dVar8 = 0.0;
        sVar14 = numPoints;
        local_c8 = 0.0;
        do {
          uVar1 = *(undefined8 *)((long)A + lVar12 + -8);
          dVar11 = (double)*(float *)((long)&B->x + lVar12) - dVar32;
          dVar23 = (double)*(float *)((long)&A->x + lVar12) - local_188;
          dVar26 = (double)(float)uVar1 - local_178._0_8_;
          dVar27 = (double)(float)((ulong)uVar1 >> 0x20) - local_178._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar12 + -8);
          dVar29 = (double)(float)uVar1 - dVar33;
          dVar30 = (double)(float)((ulong)uVar1 >> 0x20) - dVar21;
          local_108 = local_108 + dVar29 * dVar26;
          dStack_100 = dStack_100 + dVar29 * dVar27;
          dVar28 = dVar28 + dVar23 * dVar29;
          dVar25 = dVar25 + dVar26 * dVar30;
          dVar24 = dVar24 + dVar27 * dVar30;
          dVar6 = dVar6 + dVar23 * dVar30;
          dVar7 = dVar7 + dVar11 * dVar26;
          dVar8 = dVar8 + dVar11 * dVar27;
          local_c8 = local_c8 + dVar23 * dVar11;
          lVar12 = lVar12 + 0xc;
          sVar14 = sVar14 - 1;
        } while (sVar14 != 0);
      }
      else {
        lVar12 = 2;
        sVar14 = 0;
        dVar28 = 0.0;
        dVar25 = 0.0;
        dVar24 = 0.0;
        dVar6 = 0.0;
        dVar7 = 0.0;
        dVar8 = 0.0;
        do {
          dVar26 = (double)weights[sVar14];
          dVar23 = ((double)(&B->x)[lVar12] - dVar32) * dVar26;
          dVar11 = (double)(&A->x)[lVar12] - local_188;
          uVar1 = *(undefined8 *)((long)A + lVar12 * 4 + -8);
          dVar29 = (double)(float)uVar1 - local_178._0_8_;
          dVar30 = (double)(float)((ulong)uVar1 >> 0x20) - local_178._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar12 * 4 + -8);
          dVar27 = dVar26 * ((double)(float)uVar1 - dVar33);
          dVar26 = dVar26 * ((double)(float)((ulong)uVar1 >> 0x20) - dVar21);
          local_108 = local_108 + dVar27 * dVar29;
          dStack_100 = dStack_100 + dVar27 * dVar30;
          dVar28 = dVar28 + dVar11 * dVar27;
          dVar25 = dVar25 + dVar29 * dVar26;
          dVar24 = dVar24 + dVar30 * dVar26;
          dVar6 = dVar6 + dVar11 * dVar26;
          dVar7 = dVar7 + dVar23 * dVar29;
          dVar8 = dVar8 + dVar23 * dVar30;
          local_c8 = local_c8 + dVar11 * dVar23;
          sVar14 = sVar14 + 1;
          lVar12 = lVar12 + 3;
        } while (numPoints != sVar14);
      }
      A_00 = (double (*) [3])&local_108;
      local_f8._8_4_ = SUB84(dVar25,0);
      local_f8._0_8_ = dVar28;
      local_f8._12_4_ = (int)((ulong)dVar25 >> 0x20);
      local_e8._8_4_ = SUB84(dVar6,0);
      local_e8._0_8_ = dVar24;
      local_e8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_d8._8_4_ = SUB84(dVar8,0);
      local_d8._0_8_ = dVar7;
      local_d8._12_4_ = (int)((ulong)dVar8 >> 0x20);
      local_150.x[1][0] = 0.0;
      lVar12 = 0;
      local_150.x[2][1] = 0.0;
      local_150.x[1][2] = 0.0;
      local_150.x[2][0] = 0.0;
      local_150.x[0][1] = 0.0;
      local_150.x[0][2] = 0.0;
      local_150.x[0][0] = 1.0;
      local_150.x[1][1] = 1.0;
      local_150.x[2][2] = 1.0;
      V_00 = (double (*) [3])&local_78;
      local_60 = 0;
      local_40 = 0;
      local_50 = 0;
      uStack_48 = 0;
      local_70 = 0.0;
      dStack_68 = 0.0;
      local_78 = 1.0;
      uStack_58 = 0x3ff0000000000000;
      local_38 = 0x3ff0000000000000;
      dStack_180 = local_188;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_150,&local_168,(Matrix33<double> *)V_00,
                        2.220446049250313e-16,true);
      local_c0 = local_150.x[0][0];
      local_b8 = local_150.x[1][0];
      local_b0 = local_150.x[2][0];
      local_a8 = local_150.x[0][1];
      local_a0 = local_150.x[1][1];
      local_98 = local_150.x[2][1];
      local_90 = local_150.x[0][2];
      local_88 = local_150.x[1][2];
      local_80 = local_150.x[2][2];
      local_1d8[8] = 0.0;
      local_1d8[6] = 0.0;
      local_1d8[7] = 0.0;
      local_1d8[4] = 0.0;
      local_1d8[5] = 0.0;
      local_1d8[2] = 0.0;
      local_1d8[3] = 0.0;
      local_1d8[0] = 0.0;
      local_1d8[1] = 0.0;
      do {
        lVar16 = 0;
        pdVar13 = &local_c0;
        do {
          dVar28 = local_1d8[lVar12 * 3 + lVar16];
          lVar17 = 0;
          pdVar15 = pdVar13;
          do {
            dVar28 = dVar28 + (*(double (*) [3])*V_00)[lVar17] * *pdVar15;
            lVar17 = lVar17 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar17 != 3);
          local_1d8[lVar12 * 3 + lVar16] = dVar28;
          lVar16 = lVar16 + 1;
          pdVar13 = pdVar13 + 1;
        } while (lVar16 != 3);
        lVar12 = lVar12 + 1;
        V_00 = V_00 + 1;
      } while (lVar12 != 3);
      if (doScale && numPoints != 1) {
        if (weights == (float *)0x0) {
          pfVar18 = &A->z;
          dVar28 = 0.0;
          dVar25 = 0.0;
          do {
            dVar24 = (double)((Vec3<float> *)(pfVar18 + -2))->x - (double)local_178._0_8_;
            dVar28 = (((double)*pfVar18 - local_188) * ((double)*pfVar18 - local_188) +
                     dVar24 * dVar24 +
                     ((double)pfVar18[-1] - (double)local_178._8_8_) *
                     ((double)pfVar18[-1] - (double)local_178._8_8_)) - dVar28;
            dVar24 = dVar25 + dVar28;
            dVar28 = (dVar24 - dVar25) - dVar28;
            pfVar18 = pfVar18 + 3;
            numPoints = numPoints - 1;
            dVar25 = dVar24;
          } while (numPoints != 0);
        }
        else {
          pfVar18 = &A->z;
          sVar14 = 0;
          dVar28 = 0.0;
          dVar25 = 0.0;
          do {
            dVar24 = (double)((Vec3<float> *)(pfVar18 + -2))->x - (double)local_178._0_8_;
            dVar28 = (((double)*pfVar18 - local_188) * ((double)*pfVar18 - local_188) +
                     dVar24 * dVar24 +
                     ((double)pfVar18[-1] - (double)local_178._8_8_) *
                     ((double)pfVar18[-1] - (double)local_178._8_8_)) * (double)weights[sVar14] -
                     dVar28;
            dVar24 = dVar25 + dVar28;
            dVar28 = (dVar24 - dVar25) - dVar28;
            sVar14 = sVar14 + 1;
            pfVar18 = pfVar18 + 3;
            dVar25 = dVar24;
          } while (numPoints != sVar14);
        }
        dVar28 = 0.0;
        pdVar13 = local_1d8;
        lVar12 = 0;
        dVar25 = 0.0;
        do {
          lVar16 = 0;
          pdVar15 = pdVar13;
          dVar6 = dVar28;
          do {
            dVar25 = *pdVar15 * (*(double (*) [3])*A_00)[lVar16] - dVar25;
            dVar28 = dVar6 + dVar25;
            dVar25 = (dVar28 - dVar6) - dVar25;
            lVar16 = lVar16 + 1;
            pdVar15 = pdVar15 + 3;
            dVar6 = dVar28;
          } while (lVar16 != 3);
          lVar12 = lVar12 + 1;
          A_00 = A_00 + 1;
          pdVar13 = pdVar13 + 1;
        } while (lVar12 != 3);
        dVar28 = dVar28 / dVar24;
      }
      else {
        dVar28 = 1.0;
      }
      dVar24 = (double)local_178._0_8_ * dVar28;
      dVar25 = (double)local_178._8_8_ * dVar28;
      local_188 = local_188 * dVar28;
      auVar9._8_4_ = SUB84(dVar28 * local_1d8[1],0);
      auVar9._0_8_ = dVar28 * local_1d8[0];
      auVar9._12_4_ = (int)((ulong)(dVar28 * local_1d8[1]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[0] = auVar9;
      __return_storage_ptr__->x[0][2] = local_1d8[2] * dVar28;
      __return_storage_ptr__->x[0][3] = 0.0;
      auVar10._8_4_ = SUB84(dVar28 * local_1d8[4],0);
      auVar10._0_8_ = dVar28 * local_1d8[3];
      auVar10._12_4_ = (int)((ulong)(dVar28 * local_1d8[4]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[1] = auVar10;
      __return_storage_ptr__->x[1][2] = local_1d8[5] * dVar28;
      __return_storage_ptr__->x[1][3] = 0.0;
      auVar5._8_4_ = SUB84(dVar28 * local_1d8[7],0);
      auVar5._0_8_ = dVar28 * local_1d8[6];
      auVar5._12_4_ = (int)((ulong)(dVar28 * local_1d8[7]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[2] = auVar5;
      __return_storage_ptr__->x[2][2] = local_1d8[8] * dVar28;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           dVar33 - (local_188 * local_1d8[6] + dVar24 * local_1d8[0] + dVar25 * local_1d8[3]);
      __return_storage_ptr__->x[3][1] =
           dVar21 - (local_188 * local_1d8[7] + dVar24 * local_1d8[1] + dVar25 * local_1d8[4]);
      __return_storage_ptr__->x[3][2] =
           dVar32 - (local_188 * local_1d8[8] + dVar24 * local_1d8[2] + dVar25 * local_1d8[5]);
    }
    else {
      __return_storage_ptr__->x[1][1] = 0.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (const Vec3<T>* A, const Vec3<T>* B, const T* weights, const size_t numPoints, const bool doScale)
{
    if (numPoints == 0)
        return M44d();

    // Always do the accumulation in double precision:
    V3d Acenter (0.0);
    V3d Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0)
        return M44d();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C += outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d S;
    jacobiSVD (C, U, S, V, IMATH_INTERNAL_NAMESPACE::limits<double>::epsilon(), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).  
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.  
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((double) weights[i]) * ((V3d) A[i] - Acenter).length2();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get() / traceATA.get();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).  
    const V3d translate = Bcenter - s*Acenter*Qt;

    return M44d (s*Qt.x[0][0], s*Qt.x[0][1], s*Qt.x[0][2], T(0),
                 s*Qt.x[1][0], s*Qt.x[1][1], s*Qt.x[1][2], T(0),
                 s*Qt.x[2][0], s*Qt.x[2][1], s*Qt.x[2][2], T(0),
                 translate.x, translate.y, translate.z, T(1));
}